

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O0

void __thiscall
chatra::AsyncOperatorTable::add
          (AsyncOperatorTable *this,Package *package,Node *node,Operator op,
          vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_> *args)

{
  reference local_38;
  value_type *method;
  vector<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_> *args_local;
  Node *pNStack_20;
  Operator op_local;
  Node *node_local;
  Package *package_local;
  AsyncOperatorTable *this_local;
  
  method = (value_type *)args;
  args_local._7_1_ = op;
  pNStack_20 = node;
  node_local = (Node *)package;
  package_local = (Package *)this;
  std::forward_list<chatra::OperatorMethod,std::allocator<chatra::OperatorMethod>>::
  emplace_front<chatra::Package*&,chatra::Node*&,chatra::Operator&,std::vector<chatra::ArgumentDef,std::allocator<chatra::ArgumentDef>>>
            ((forward_list<chatra::OperatorMethod,std::allocator<chatra::OperatorMethod>> *)
             &this->methods,(Package **)&node_local,&stack0xffffffffffffffe0,
             (Operator *)((long)&args_local + 7),args);
  local_38 = std::forward_list<chatra::OperatorMethod,_std::allocator<chatra::OperatorMethod>_>::
             front(&this->methods);
  AsyncReadWrite<chatra::OperatorTable>::
  writeAsync<chatra::AsyncOperatorTable::add(chatra::Package*,chatra::Node*,chatra::Operator,std::vector<chatra::ArgumentDef,std::allocator<chatra::ArgumentDef>>)::_lambda(chatra::OperatorTable&)_1_>
            (&this->super_AsyncReadWrite<chatra::OperatorTable>,(anon_class_8_1_60e9c21f)&local_38);
  return;
}

Assistant:

void add(Package* package, Node* node, Operator op, std::vector<ArgumentDef> args) {
		methods.emplace_front(package, node, op, std::move(args));
		auto method = &methods.front();
		writeAsync([&](OperatorTable& table) {
			if (method->args.size() == 1)
				table.addOp1(method);
			else
				table.addOp2(method);
		});
	}